

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Clock.cxx
# Opt level: O1

void __thiscall Fl_Clock_Output::draw(Fl_Clock_Output *this)

{
  draw(this,(this->super_Fl_Widget).x_,(this->super_Fl_Widget).y_,(this->super_Fl_Widget).w_,
       (this->super_Fl_Widget).h_);
  Fl_Widget::draw_label(&this->super_Fl_Widget);
  return;
}

Assistant:

void Fl_Clock_Output::draw() {
  draw(x(), y(), w(), h());
  draw_label();
}